

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_set_senfh(acmod_t *acmod,FILE *logfh)

{
  FILE *logfh_local;
  acmod_t *acmod_local;
  
  if (acmod->senfh != (FILE *)0x0) {
    fclose((FILE *)acmod->senfh);
  }
  acmod->senfh = logfh;
  if (logfh == (FILE *)0x0) {
    acmod_local._4_4_ = 0;
  }
  else {
    acmod_local._4_4_ = acmod_write_senfh_header(acmod,logfh);
  }
  return acmod_local._4_4_;
}

Assistant:

int
acmod_set_senfh(acmod_t *acmod, FILE *logfh)
{
    if (acmod->senfh)
        fclose(acmod->senfh);
    acmod->senfh = logfh;
    if (logfh == NULL)
        return 0;
    return acmod_write_senfh_header(acmod, logfh);
}